

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O0

optional<EncodingConversion> *
transcoding_to(optional<EncodingConversion> *__return_storage_ptr__,char *name)

{
  int iVar1;
  EncodingConversion local_50;
  iconv_t local_40;
  iconv_t conversion;
  EncodingConversion local_28;
  char *local_18;
  char *name_local;
  
  local_18 = name;
  name_local = (char *)__return_storage_ptr__;
  iVar1 = strcmp(name,"UTF-8");
  if (iVar1 == 0) {
    EncodingConversion::EncodingConversion(&local_28,1,(void *)0x0);
    optional<EncodingConversion>::optional(__return_storage_ptr__,&local_28);
    EncodingConversion::~EncodingConversion(&local_28);
  }
  else {
    local_40 = iconv_open(local_18,"UTF-16LE");
    if (local_40 == (iconv_t)0xffffffffffffffff) {
      optional<EncodingConversion>::optional(__return_storage_ptr__);
    }
    else {
      EncodingConversion::EncodingConversion(&local_50,0,local_40);
      optional<EncodingConversion>::optional(__return_storage_ptr__,&local_50);
      EncodingConversion::~EncodingConversion(&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

optional<EncodingConversion> transcoding_to(const char *name) {
  if (strcmp(name, "UTF-8") == 0) {
    return optional { EncodingConversion{UTF16_TO_UTF8, nullptr} };
  } else {
    iconv_t conversion = iconv_open(name, "UTF-16LE");
    return conversion == reinterpret_cast<iconv_t>(-1) ?
      optional<EncodingConversion>{} :
      optional { EncodingConversion(GENERAL, conversion) };
  }
}